

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::ProgramFanoutBigProgram(void)

{
  int iVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  LogMessage local_fe8;
  key_type local_e64;
  LogMessage local_e60;
  LogMessage local_ce0;
  key_type local_b5c;
  LogMessage local_b58;
  LogMessage local_9d8;
  key_type local_854;
  LogMessage local_850;
  LogMessage local_6d0;
  key_type local_54c;
  LogMessage local_548;
  undefined1 local_3c8 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> histogram;
  RE2 re1000;
  RE2 re100;
  undefined1 local_1c8 [8];
  RE2 re10;
  RE2 re1;
  
  RE2::RE2((RE2 *)&re10.named_groups_once_,"(?:(?:(?:(?:(?:.)?){1})*)+)");
  RE2::RE2((RE2 *)local_1c8,"(?:(?:(?:(?:(?:.)?){10})*)+)");
  RE2::RE2((RE2 *)&re1000.named_groups_once_,"(?:(?:(?:(?:(?:.)?){100})*)+)");
  RE2::RE2((RE2 *)&histogram._M_t._M_impl.super__Rb_tree_header._M_node_count,
           "(?:(?:(?:(?:(?:.)?){1000})*)+)");
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_3c8
            );
  iVar1 = RE2::ProgramFanout((RE2 *)&re10.named_groups_once_,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)local_3c8);
  if (iVar1 != 3) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_548,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1e2);
    poVar3 = LogMessage::stream(&local_548);
    std::operator<<(poVar3,"Check failed: (3) == (re1.ProgramFanout(&histogram))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_548);
  }
  local_54c = 3;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_3c8,&local_54c);
  if (*pmVar2 != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_6d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1e3);
    poVar3 = LogMessage::stream(&local_6d0);
    std::operator<<(poVar3,"Check failed: (1) == (histogram[3])");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_6d0);
  }
  iVar1 = RE2::ProgramFanout((RE2 *)local_1c8,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)local_3c8);
  if (iVar1 != 7) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_850,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1e6);
    poVar3 = LogMessage::stream(&local_850);
    std::operator<<(poVar3,"Check failed: (7) == (re10.ProgramFanout(&histogram))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_850);
  }
  local_854 = 7;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_3c8,&local_854);
  if (*pmVar2 != 10) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_9d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1e7);
    poVar3 = LogMessage::stream(&local_9d8);
    std::operator<<(poVar3,"Check failed: (10) == (histogram[7])");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_9d8);
  }
  iVar1 = RE2::ProgramFanout((RE2 *)&re1000.named_groups_once_,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)local_3c8);
  if (iVar1 != 10) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b58,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1ea);
    poVar3 = LogMessage::stream(&local_b58);
    std::operator<<(poVar3,"Check failed: (10) == (re100.ProgramFanout(&histogram))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_b58);
  }
  local_b5c = 10;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_3c8,&local_b5c);
  if (*pmVar2 != 100) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_ce0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1eb);
    poVar3 = LogMessage::stream(&local_ce0);
    std::operator<<(poVar3,"Check failed: (100) == (histogram[10])");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_ce0);
  }
  iVar1 = RE2::ProgramFanout((RE2 *)&histogram._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)local_3c8);
  if (iVar1 != 0xd) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e60,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1ee);
    poVar3 = LogMessage::stream(&local_e60);
    std::operator<<(poVar3,"Check failed: (13) == (re1000.ProgramFanout(&histogram))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e60);
  }
  local_e64 = 0xd;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_3c8,&local_e64);
  if (*pmVar2 != 1000) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_fe8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x1ef);
    poVar3 = LogMessage::stream(&local_fe8);
    std::operator<<(poVar3,"Check failed: (1000) == (histogram[13])");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_fe8);
  }
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_3c8
            );
  RE2::~RE2((RE2 *)&histogram._M_t._M_impl.super__Rb_tree_header._M_node_count);
  RE2::~RE2((RE2 *)&re1000.named_groups_once_);
  RE2::~RE2((RE2 *)local_1c8);
  RE2::~RE2((RE2 *)&re10.named_groups_once_);
  return;
}

Assistant:

TEST(ProgramFanout, BigProgram) {
  RE2 re1("(?:(?:(?:(?:(?:.)?){1})*)+)");
  RE2 re10("(?:(?:(?:(?:(?:.)?){10})*)+)");
  RE2 re100("(?:(?:(?:(?:(?:.)?){100})*)+)");
  RE2 re1000("(?:(?:(?:(?:(?:.)?){1000})*)+)");

  map<int, int> histogram;

  // 3 is the largest non-empty bucket and has 1 element.
  CHECK_EQ(3, re1.ProgramFanout(&histogram));
  CHECK_EQ(1, histogram[3]);

  // 7 is the largest non-empty bucket and has 10 elements.
  CHECK_EQ(7, re10.ProgramFanout(&histogram));
  CHECK_EQ(10, histogram[7]);

  // 10 is the largest non-empty bucket and has 100 elements.
  CHECK_EQ(10, re100.ProgramFanout(&histogram));
  CHECK_EQ(100, histogram[10]);

  // 13 is the largest non-empty bucket and has 1000 elements.
  CHECK_EQ(13, re1000.ProgramFanout(&histogram));
  CHECK_EQ(1000, histogram[13]);
}